

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container.cpp
# Opt level: O2

void mountDirectories(Container *container)

{
  Verbosity VVar1;
  int iVar2;
  runtime_error *prVar3;
  int *piVar4;
  double __x;
  double __x_00;
  string local_a0 [8];
  string containerDir;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40;
  
  std::__cxx11::string::string(local_a0,(string *)&container->dir);
  VVar1 = loguru::current_verbosity_cutoff();
  if (-1 < VVar1) {
    loguru::log(__x);
  }
  iVar2 = mount("proc","/proc","proc",0,(void *)0x0);
  if (iVar2 != 0) {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    piVar4 = __errno_location();
    std::__cxx11::to_string(&local_40,*piVar4);
    std::operator+(&local_60,"Mount /proc: FAILED [Errno ",&local_40);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&containerDir.field_2 + 8),&local_60,"]");
    std::runtime_error::runtime_error(prVar3,(string *)(containerDir.field_2._M_local_buf + 8));
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar2 = mount("sysfs","/sys","sysfs",0,(void *)0x0);
  if (iVar2 != 0) {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    piVar4 = __errno_location();
    std::__cxx11::to_string(&local_40,*piVar4);
    std::operator+(&local_60,"Mount /sys: FAILED [Errno ",&local_40);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&containerDir.field_2 + 8),&local_60,"]");
    std::runtime_error::runtime_error(prVar3,(string *)(containerDir.field_2._M_local_buf + 8));
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar2 = mount("tmpfs","/dev","tmpfs",0x1000002,(void *)0x0);
  if (iVar2 == 0) {
    VVar1 = loguru::current_verbosity_cutoff();
    if (-1 < VVar1) {
      loguru::log(__x_00);
    }
    std::__cxx11::string::~string(local_a0);
    return;
  }
  prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
  piVar4 = __errno_location();
  std::__cxx11::to_string(&local_40,*piVar4);
  std::operator+(&local_60,"Mount /dev: FAILED [Errno ",&local_40);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&containerDir.field_2 + 8),&local_60,"]");
  std::runtime_error::runtime_error(prVar3,(string *)(containerDir.field_2._M_local_buf + 8));
  __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void mountDirectories(Container* container)
{
    std::string containerDir = container->dir;
    LOG_F(INFO, "Mounting directories: proc, sys, dev");

    if (mount("proc", "/proc", "proc", 0, nullptr) != 0)
        throw std::runtime_error("Mount /proc: FAILED [Errno " + std::to_string(errno) + "]");

    if (mount("sysfs", "/sys", "sysfs", 0, nullptr) != 0)
        throw std::runtime_error("Mount /sys: FAILED [Errno " + std::to_string(errno) + "]");

    if (mount("tmpfs", "/dev", "tmpfs", MS_NOSUID | MS_STRICTATIME, nullptr) != 0)
        throw std::runtime_error("Mount /dev: FAILED [Errno " + std::to_string(errno) + "]");

    LOG_F(INFO, "Mounting directories: SUCCESS");
}